

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quuid.h
# Opt level: O2

strong_ordering QUuid::compareThreeWay_helper(QUuid *lhs,QUuid *rhs)

{
  uchar *puVar1;
  uchar *puVar2;
  byte bVar3;
  uint i;
  long lVar4;
  
  bVar3 = -(lhs->data1 < rhs->data1);
  if (lhs->data1 == rhs->data1) {
    if (lhs->data2 != rhs->data2) {
      return (strong_ordering)(-(lhs->data2 < rhs->data2) | 1);
    }
    bVar3 = -(lhs->data3 < rhs->data3);
    if (lhs->data3 == rhs->data3) {
      lVar4 = 0;
      do {
        if (lVar4 == 8) {
          return (strong_ordering)'\0';
        }
        puVar1 = lhs->data4 + lVar4;
        puVar2 = rhs->data4 + lVar4;
        lVar4 = lVar4 + 1;
      } while (*puVar1 == *puVar2);
      bVar3 = -(*puVar1 < *puVar2);
    }
  }
  return (strong_ordering)(bVar3 | 1);
}

Assistant:

static constexpr Qt::strong_ordering
    compareThreeWay_helper(const QUuid &lhs, const QUuid &rhs) noexcept
    {
#if QT_VERSION < QT_VERSION_CHECK(7, 0, 0) && !defined(QT_BOOTSTRAPPED)
        if (const auto c = Qt::compareThreeWay(lhs.data1, rhs.data1); !is_eq(c))
            return c;
        if (const auto c = Qt::compareThreeWay(lhs.data2, rhs.data2); !is_eq(c))
            return c;
        if (const auto c = Qt::compareThreeWay(lhs.data3, rhs.data3); !is_eq(c))
            return c;
#elif defined(__cpp_lib_bit_cast) && defined(QT_SUPPORTS_INT128)
        quint128 lu = qFromBigEndian(std::bit_cast<quint128>(lhs));
        quint128 ru = qFromBigEndian(std::bit_cast<quint128>(rhs));
        return Qt::compareThreeWay(lu, ru);
#else
        auto make_int = [](const QUuid &u) {
            quint64 result = quint64(u.data3) << 48;
            result |= quint64(u.data2) << 32;
            return qFromBigEndian(result | u.data1);
        };
        if (const auto c = Qt::compareThreeWay(make_int(lhs), make_int(rhs)); !is_eq(c))
            return c;
#endif
        for (unsigned i = 0; i < sizeof(lhs.data4); ++i) {
            if (const auto c = Qt::compareThreeWay(lhs.data4[i], rhs.data4[i]); !is_eq(c))
                return c;
        }
        return Qt::strong_ordering::equal;
    }